

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void compact_reopen_with_iterator(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t metalen;
  void *meta;
  fdb_kvs_handle *in_stack_fffffffffffffa98;
  fdb_file_handle *in_stack_fffffffffffffaa0;
  fdb_iterator *in_stack_fffffffffffffaa8;
  size_t in_stack_fffffffffffffac0;
  uint32_t *in_stack_fffffffffffffb10;
  fdb_iterator *in_stack_fffffffffffffb18;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_iterator *iterator;
  fdb_kvs_info kvs_info;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *db;
  fdb_file_handle *compact_file;
  fdb_file_handle *dbfile;
  int local_68;
  int nkvdocs;
  int count;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  local_68 = 0;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fdb_open((fdb_file_handle **)bodybuf._152_8_,(char *)bodybuf._144_8_,(fdb_config *)bodybuf._136_8_
          );
  fdb_kvs_open((fdb_file_handle *)bodybuf._40_8_,(fdb_kvs_handle **)bodybuf._32_8_,
               (char *)bodybuf._24_8_,(fdb_kvs_config *)bodybuf._16_8_);
  fVar1 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"compact_reopen_with_iterator")
  ;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x29b);
    compact_reopen_with_iterator::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x29b,"void compact_reopen_with_iterator()");
    }
  }
  for (n = 0; n < 9; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    in_stack_fffffffffffffb10 = &fconfig.num_blocks_readahead;
    meta = (void *)0x1076e3;
    metalen = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                   (size_t)in_stack_fffffffffffffa98,meta,metalen,(void *)0x10771a,
                   in_stack_fffffffffffffac0);
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffffa98 + (long)n * 8));
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffffa98,'\0');
  fdb_open((fdb_file_handle **)bodybuf._152_8_,(char *)bodybuf._144_8_,(fdb_config *)bodybuf._136_8_
          );
  fVar1 = fdb_compact(in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x2ad);
    compact_reopen_with_iterator::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x2ad,"void compact_reopen_with_iterator()");
    }
  }
  fdb_close((fdb_file_handle *)in_stack_fffffffffffffa98);
  n = 0;
  fVar1 = fdb_iterator_init((fdb_kvs_handle *)doc,(fdb_iterator **)(keybuf + 0xf8),(void *)0x0,0,
                            (void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x2b3);
    compact_reopen_with_iterator::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x2b3,"void compact_reopen_with_iterator()");
    }
  }
  while( true ) {
    fVar1 = fdb_iterator_get(in_stack_fffffffffffffb18,(fdb_doc **)in_stack_fffffffffffffb10);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x2b6);
      compact_reopen_with_iterator::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x2b6,"void compact_reopen_with_iterator()");
      }
    }
    iVar2 = memcmp(pvRam0000000000000020,
                   *(void **)(*(long *)(&stack0xfffffffffffffa98 + (long)n * 8) + 0x20),
                   sRam0000000000000000);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)(*(long *)(&stack0xfffffffffffffa98 + (long)n * 8) + 0x20),
              pvRam0000000000000020,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x2b8);
      compact_reopen_with_iterator::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x2b8,"void compact_reopen_with_iterator()");
    }
    iVar2 = memcmp(pvRam0000000000000038,
                   *(void **)(*(long *)(&stack0xfffffffffffffa98 + (long)n * 8) + 0x38),
                   sRam0000000000000008);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)(*(long *)(&stack0xfffffffffffffa98 + (long)n * 8) + 0x38),
              pvRam0000000000000038,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x2b9);
      compact_reopen_with_iterator::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x2b9,"void compact_reopen_with_iterator()");
    }
    iVar2 = memcmp(pvRam0000000000000040,
                   *(void **)(*(long *)(&stack0xfffffffffffffa98 + (long)n * 8) + 0x40),
                   sRam0000000000000010);
    if (iVar2 != 0) break;
    fdb_doc_free((fdb_doc *)0x107aed);
    n = n + 1;
    local_68 = local_68 + 1;
    fVar1 = fdb_iterator_next((fdb_iterator *)in_stack_fffffffffffffa98);
    if (fVar1 == FDB_RESULT_ITERATOR_FAIL) {
      if (local_68 != 9) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x2c2);
        compact_reopen_with_iterator::__test_pass = 0;
        if (local_68 != 9) {
          __assert_fail("count==n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x2c2,"void compact_reopen_with_iterator()");
        }
      }
      fVar1 = fdb_iterator_close(in_stack_fffffffffffffaa8);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x2c6);
        compact_reopen_with_iterator::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x2c6,"void compact_reopen_with_iterator()");
        }
      }
      fdb_get_kvs_info((fdb_kvs_handle *)fconfig.num_keeping_headers,
                       (fdb_kvs_info *)fconfig.max_block_reusing_cycle);
      fdb_kvs_close(in_stack_fffffffffffffa98);
      fdb_close((fdb_file_handle *)in_stack_fffffffffffffa98);
      fdb_open((fdb_file_handle **)bodybuf._152_8_,(char *)bodybuf._144_8_,
               (fdb_config *)bodybuf._136_8_);
      fdb_kvs_open((fdb_file_handle *)bodybuf._40_8_,(fdb_kvs_handle **)bodybuf._32_8_,
                   (char *)bodybuf._24_8_,(fdb_kvs_config *)bodybuf._16_8_);
      fdb_get_kvs_info((fdb_kvs_handle *)fconfig.num_keeping_headers,
                       (fdb_kvs_info *)fconfig.max_block_reusing_cycle);
      if ((long)(int)kvs_info.last_seqnum != kvs_info.last_seqnum) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x2d6);
        compact_reopen_with_iterator::__test_pass = 0;
        if ((long)(int)kvs_info.last_seqnum != kvs_info.last_seqnum) {
          __assert_fail("(uint64_t)nkvdocs == kvs_info.doc_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x2d6,"void compact_reopen_with_iterator()");
        }
      }
      fdb_kvs_close(in_stack_fffffffffffffa98);
      fdb_close((fdb_file_handle *)in_stack_fffffffffffffa98);
      for (n = 0; n < 9; n = n + 1) {
        fdb_doc_free((fdb_doc *)0x107d03);
      }
      fdb_shutdown();
      memleak_end();
      if (compact_reopen_with_iterator::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","compact reopen with iterator");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","compact reopen with iterator");
      }
      return;
    }
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
          *(undefined8 *)(*(long *)(&stack0xfffffffffffffa98 + (long)n * 8) + 0x40),
          pvRam0000000000000040,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0x2ba);
  compact_reopen_with_iterator::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x2ba,"void compact_reopen_with_iterator()");
}

Assistant:

void compact_reopen_with_iterator()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 9;
    int count = 0;
    int nkvdocs;
    fdb_file_handle *dbfile, *compact_file;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_kvs_info kvs_info;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db",  &kvs_config);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_reopen_with_iterator");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // MB-13859: compact the file using a separate handle..
    fdb_open(&compact_file, "./compact_test1", &fconfig);
    // compact
    status = fdb_compact(compact_file, "./compact_test2");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // close file after compaction to make the new_file's ref count 0
    fdb_close(compact_file);

    i = 0;
    status = fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);

    TEST_CHK(count==n);


    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // save ndocs
    fdb_get_kvs_info(db, &kvs_info);
    nkvdocs = kvs_info.doc_count;

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen
    fdb_open(&dbfile, "./compact_test2", &fconfig);
    fdb_kvs_open(dbfile, &db, "db",  &kvs_config);

    // verify kvs stats
    fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK((uint64_t)nkvdocs == kvs_info.doc_count);

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compact reopen with iterator");
}